

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O3

void __thiscall
Inline::InsertOneInlinee
          (Inline *this,Instr *callInstr,RegOpnd *returnValueOpnd,Opnd *methodOpnd,
          FunctionJITTimeInfo *inlineeJITData,FunctionJITRuntimeInfo *inlineeRuntimeData,
          LabelInstr *doneLabel,StackSym *symCallerThis,bool fixedFunctionSafeThis,
          uint recursiveInlineDepth)

{
  Func *pFVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  ArgSlot actualCount;
  ArgSlot AVar6;
  RegSlot returnRegSlot;
  RegOpnd *dstOpnd;
  Instr *this_00;
  JITTimeFunctionBody *funcBody;
  Func *pFVar7;
  undefined4 *puVar8;
  Instr *pIVar9;
  Instr *instr;
  IntConstOpnd *this_01;
  Opnd *pOVar10;
  BranchInstr *pBVar11;
  Instr *pIStack_f8;
  Instr *argOuts [15];
  bool local_31 [8];
  bool stackArgsArgOutExpanded;
  
  bVar3 = FunctionJITTimeInfo::IsInlined(inlineeJITData);
  if (bVar3) {
    dstOpnd = IR::RegOpnd::New(TyVar,callInstr->m_func);
    this_00 = IR::Instr::New(InlineeStart,&dstOpnd->super_Opnd,methodOpnd,callInstr->m_func);
  }
  else {
    this_00 = IR::Instr::New(callInstr->m_opcode,callInstr->m_func);
    IR::Instr::SetByteCodeOffset(this_00,callInstr);
    if (this_00->m_src1 != (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
      if (!bVar4) goto LAB_00546849;
      *puVar8 = 0;
    }
    pFVar7 = this_00->m_func;
    if (methodOpnd->isDeleted == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x14,"(!isDeleted)","Using deleted operand");
      if (!bVar4) goto LAB_00546849;
      *puVar8 = 0;
    }
    bVar5 = methodOpnd->field_0xb;
    if ((bVar5 & 2) != 0) {
      methodOpnd = IR::Opnd::Copy(methodOpnd,pFVar7);
      bVar5 = methodOpnd->field_0xb;
    }
    methodOpnd->field_0xb = bVar5 | 2;
    this_00->m_src1 = methodOpnd;
    if (returnValueOpnd != (RegOpnd *)0x0) {
      IR::Instr::SetDst(this_00,&returnValueOpnd->super_Opnd);
    }
  }
  this_00->field_0x38 = this_00->field_0x38 | 8;
  pIVar9 = callInstr;
  IR::Instr::InsertBefore(callInstr,this_00);
  CloneCallSequence((Inline *)pIVar9,callInstr,this_00);
  if (!bVar3) {
    pBVar11 = IR::BranchInstr::New(Br,doneLabel,callInstr->m_func);
    IR::Instr::InsertBefore(callInstr,&pBVar11->super_Instr);
    return;
  }
  funcBody = FunctionJITTimeInfo::GetBody(inlineeJITData);
  if (returnValueOpnd == (RegOpnd *)0x0) {
    returnRegSlot = 0xffffffff;
  }
  else {
    returnRegSlot = StackSym::GetByteCodeRegSlot(returnValueOpnd->m_sym);
  }
  pFVar7 = BuildInlinee(this,funcBody,inlineeJITData,inlineeRuntimeData,returnRegSlot,callInstr,
                        recursiveInlineDepth);
  argOuts[0xd] = (Instr *)0xfefefefefefefefe;
  argOuts[0xb] = (Instr *)0xfefefefefefefefe;
  argOuts[0xc] = (Instr *)0xfefefefefefefefe;
  argOuts[9] = (Instr *)0xfefefefefefefefe;
  argOuts[10] = (Instr *)0xfefefefefefefefe;
  argOuts[7] = (Instr *)0xfefefefefefefefe;
  argOuts[8] = (Instr *)0xfefefefefefefefe;
  argOuts[5] = (Instr *)0xfefefefefefefefe;
  argOuts[6] = (Instr *)0xfefefefefefefefe;
  argOuts[3] = (Instr *)0xfefefefefefefefe;
  argOuts[4] = (Instr *)0xfefefefefefefefe;
  argOuts[1] = (Instr *)0xfefefefefefefefe;
  argOuts[2] = (Instr *)0xfefefefefefefefe;
  pIStack_f8 = (Instr *)0xfefefefefefefefe;
  argOuts[0] = (Instr *)0xfefefefefefefefe;
  local_31[0] = false;
  if (callInstr->m_kind != InstrKindProfiled) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0xd5,"(this->IsProfiledInstr())","Bad call to AsProfiledInstr()");
    if (!bVar3) goto LAB_00546849;
    *puVar8 = 0;
  }
  actualCount = MapActuals(this,this_00,&pIStack_f8,0xf,pFVar7,
                           *(ProfileId *)&callInstr[1]._vptr_Instr,local_31,(Instr **)0x0,0xf);
  if (actualCount == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0x54e,"(actualCount > 0)","actualCount > 0");
    if (!bVar3) goto LAB_00546849;
    *puVar8 = 0;
  }
  pOVar10 = (Opnd *)(ulong)actualCount;
  AVar6 = JITTimeFunctionBody::GetInParamsCount(funcBody);
  MapFormals(this,pFVar7,&pIStack_f8,(uint)AVar6,(uint)actualCount,returnValueOpnd,this_00->m_src1,
             symCallerThis,local_31[0],fixedFunctionSafeThis,&pIStack_f8);
  Func::SetInlineeStart(pFVar7,this_00);
  this_00->m_func = pFVar7;
  SetupInlineeFrame(this,pFVar7,this_00,actualCount,pOVar10);
  pIVar9 = IR::Instr::New(InlineeEnd,pFVar7);
  instr = IR::Instr::GetPrevRealInstr(pFVar7->m_tailInstr);
  IR::Instr::SetByteCodeOffset(pIVar9,instr);
  this_01 = IR::IntConstOpnd::New((ulong)(actualCount + 3),TyInt32,pFVar7,false);
  if (pIVar9->m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
    if (!bVar3) goto LAB_00546849;
    *puVar8 = 0;
  }
  pFVar1 = pIVar9->m_func;
  if ((this_01->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar3) goto LAB_00546849;
    *puVar8 = 0;
  }
  bVar5 = (this_01->super_Opnd).field_0xb;
  if ((bVar5 & 2) != 0) {
    this_01 = (IntConstOpnd *)IR::Opnd::Copy(&this_01->super_Opnd,pFVar1);
    bVar5 = (this_01->super_Opnd).field_0xb;
  }
  (this_01->super_Opnd).field_0xb = bVar5 | 2;
  pIVar9->m_src1 = &this_01->super_Opnd;
  pOVar10 = this_00->m_dst;
  if (pIVar9->m_src2 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src.");
    if (!bVar3) goto LAB_00546849;
    *puVar8 = 0;
  }
  pFVar1 = pIVar9->m_func;
  if (pOVar10->isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar3) {
LAB_00546849:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar8 = 0;
  }
  bVar5 = pOVar10->field_0xb;
  if ((bVar5 & 2) != 0) {
    pOVar10 = IR::Opnd::Copy(pOVar10,pFVar1);
    bVar5 = pOVar10->field_0xb;
  }
  pOVar10->field_0xb = bVar5 | 2;
  pIVar9->m_src2 = pOVar10;
  IR::Instr::InsertBefore(pFVar7->m_tailInstr,pIVar9);
  pBVar11 = IR::BranchInstr::New(Br,doneLabel,this_00->m_func);
  IR::Instr::InsertBefore(pFVar7->m_tailInstr,&pBVar11->super_Instr);
  IR::Instr::InsertRangeAfter(this_00,pFVar7->m_headInstr->m_next,pFVar7->m_tailInstr->m_prev);
  IR::Instr::Free(pFVar7->m_headInstr);
  IR::Instr::Free(pFVar7->m_tailInstr);
  return;
}

Assistant:

void Inline::InsertOneInlinee(IR::Instr* callInstr, IR::RegOpnd* returnValueOpnd, IR::Opnd* methodOpnd,
    const FunctionJITTimeInfo * inlineeJITData, const FunctionJITRuntimeInfo * inlineeRuntimeData, IR::LabelInstr* doneLabel, const StackSym* symCallerThis, bool fixedFunctionSafeThis, uint recursiveInlineDepth)
{
    bool isInlined = inlineeJITData->IsInlined();

    IR::Instr* currentCallInstr;
    if (isInlined)
    {
        currentCallInstr = IR::Instr::New(Js::OpCode::InlineeStart, IR::RegOpnd::New(TyVar, callInstr->m_func), methodOpnd, callInstr->m_func);
    }
    else
    {
        currentCallInstr = IR::Instr::New(callInstr->m_opcode, callInstr->m_func);
        currentCallInstr->SetByteCodeOffset(callInstr);
        currentCallInstr->SetSrc1(methodOpnd);
        if (returnValueOpnd)
        {
            currentCallInstr->SetDst(returnValueOpnd);
        }
    }
    currentCallInstr->SetIsCloned(true);
    callInstr->InsertBefore(currentCallInstr);
    this->CloneCallSequence(callInstr, currentCallInstr);

    if (isInlined)
    {
        JITTimeFunctionBody *funcBody = inlineeJITData->GetBody();
        Func *inlinee = BuildInlinee(funcBody, inlineeJITData, inlineeRuntimeData, returnValueOpnd ? returnValueOpnd->m_sym->GetByteCodeRegSlot() : Js::Constants::NoRegister, callInstr, recursiveInlineDepth);

        IR::Instr *argOuts[Js::InlineeCallInfo::MaxInlineeArgoutCount];
#if DBG
        memset(argOuts, 0xFE, sizeof(argOuts));
#endif
        bool stackArgsArgOutExpanded = false;
        Js::ArgSlot actualCount = MapActuals(currentCallInstr, argOuts, Js::InlineeCallInfo::MaxInlineeArgoutCount, inlinee, (Js::ProfileId)callInstr->AsProfiledInstr()->u.profileId, &stackArgsArgOutExpanded);
        Assert(actualCount > 0);
        MapFormals(inlinee, argOuts, funcBody->GetInParamsCount(), actualCount, returnValueOpnd, currentCallInstr->GetSrc1(), symCallerThis, stackArgsArgOutExpanded, fixedFunctionSafeThis, argOuts);
        inlinee->SetInlineeStart(currentCallInstr);
        currentCallInstr->m_func = inlinee;

        // Put the meta arguments that the stack walker expects to find on the stack.
        // As all the argouts are shared among the inlinees, do this only once.
        SetupInlineeFrame(inlinee, currentCallInstr, actualCount, currentCallInstr->GetSrc1());
        
        IR::Instr* inlineeEndInstr = IR::Instr::New(Js::OpCode::InlineeEnd, inlinee);
        inlineeEndInstr->SetByteCodeOffset(inlinee->m_tailInstr->GetPrevRealInstr());
        inlineeEndInstr->SetSrc1(IR::IntConstOpnd::New(actualCount + Js::Constants::InlineeMetaArgCount, TyInt32, inlinee));
        inlineeEndInstr->SetSrc2(currentCallInstr->GetDst());
        inlinee->m_tailInstr->InsertBefore(inlineeEndInstr);

        // JMP to done at the end
        IR::Instr* doneInstr = IR::BranchInstr::New(Js::OpCode::Br, doneLabel, currentCallInstr->m_func);
        inlinee->m_tailInstr->InsertBefore(doneInstr);
        currentCallInstr->InsertRangeAfter(inlinee->m_headInstr->m_next, inlinee->m_tailInstr->m_prev);

        inlinee->m_headInstr->Free();
        inlinee->m_tailInstr->Free();
    }
    else
    {
        callInstr->InsertBefore(IR::BranchInstr::New(Js::OpCode::Br, doneLabel, callInstr->m_func));
    }
}